

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

QList<QSimplexConstraint_*> * __thiscall
QGraphicsAnchorLayoutPrivate::constraintsFromSizeHints
          (QList<QSimplexConstraint_*> *__return_storage_ptr__,QGraphicsAnchorLayoutPrivate *this,
          QList<QtGraphicsAnchorLayout::AnchorData_*> *anchors)

{
  AnchorData *pAVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ulong uVar5;
  AnchorData *pAVar6;
  QSimplexConstraint *pQVar7;
  QSimplexConstraint *pQVar8;
  bool bVar9;
  AnchorVertex *second;
  qsizetype i;
  ulong uVar10;
  uint uVar11;
  long in_FS_OFFSET;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  qreal qVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  QSimplexVariable *copy;
  double local_48;
  QSimplexConstraint *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((anchors->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QSimplexConstraint **)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_005cee79;
  }
  uVar11 = (byte)(*(anchors->d).ptr)->field_0x78 >> 4 & 1;
  second = (this->layoutCentralVertex).m_data[uVar11];
  if (second == (AnchorVertex *)0x0) {
    second = (this->layoutLastVertex).m_data[uVar11];
  }
  pAVar6 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::edgeData
                     ((this->graph).m_data + uVar11,(this->layoutFirstVertex).m_data[uVar11],second)
  ;
  if (pAVar6->from == (this->layoutFirstVertex).m_data[uVar11]) {
    qVar15 = pAVar6->maxSize;
  }
  else {
    qVar15 = -pAVar6->minSize;
  }
  if (qVar15 != *(double *)
                 (&DAT_006fff10 +
                 (ulong)((this->layoutCentralVertex).m_data[uVar11] == (AnchorVertex *)0x0) * 8)) {
    pAVar6 = (AnchorData *)0x0;
  }
  if (NAN(qVar15) ||
      NAN(*(double *)
           (&DAT_006fff10 +
           (ulong)((this->layoutCentralVertex).m_data[uVar11] == (AnchorVertex *)0x0) * 8))) {
    pAVar6 = (AnchorData *)0x0;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSimplexConstraint **)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((anchors->d).size == 0) {
LAB_005cedcc:
    pQVar8 = (QSimplexConstraint *)operator_new(0x30);
    (pQVar8->variables).d = (Data *)0x0;
    pQVar8->constant = 0.0;
    pQVar8->ratio = Equal;
    (pQVar8->helper).first = (QConcreteSimplexVariable *)0x0;
    (pQVar8->helper).second = 0.0;
    pQVar8->artificial = (QConcreteSimplexVariable *)0x0;
    local_40 = (QSimplexConstraint *)&pAVar6->super_QSimplexVariable;
    if (pAVar6 == (AnchorData *)0x0) {
      local_40 = (QSimplexConstraint *)0x0;
    }
    local_48 = 1.0;
    QHash<QSimplexVariable*,double>::emplace<double_const&>
              ((QHash<QSimplexVariable*,double> *)pQVar8,(QSimplexVariable **)&local_40,&local_48);
    pQVar8->constant = 16777215.0;
    pQVar8->ratio = LessOrEqual;
    local_40 = pQVar8;
    QtPrivate::QPodArrayOps<QSimplexConstraint*>::emplace<QSimplexConstraint*&>
              ((QPodArrayOps<QSimplexConstraint*> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,&local_40);
    QList<QSimplexConstraint_*>::end(__return_storage_ptr__);
  }
  else {
    bVar9 = true;
    uVar10 = 0;
    do {
      pAVar1 = (anchors->d).ptr[uVar10];
      if ((pAVar1->field_0x78 & 0x60) != 0x40) {
        auVar19._8_4_ = SUB84(pAVar1->maxSize,0);
        auVar19._0_8_ = pAVar1->minSize;
        auVar19._12_4_ = (int)((ulong)pAVar1->maxSize >> 0x20);
        auVar19 = minpd(_DAT_0066f580,auVar19);
        auVar19 = maxpd(auVar19,_DAT_006fff20);
        dVar20 = auVar19._8_8_;
        dVar18 = auVar19._0_8_;
        if ((dVar18 != dVar20) || (NAN(dVar18) || NAN(dVar20))) {
          dVar4 = dVar18 - dVar20;
          uVar12 = -(ulong)(dVar4 < -dVar4);
          uVar13 = -(ulong)(dVar18 < -dVar18);
          uVar14 = -(ulong)(dVar20 < -dVar20);
          uVar5 = (ulong)-dVar20 & uVar14;
          auVar17._0_8_ = ~uVar13 & (ulong)dVar18;
          auVar17._8_8_ = ~uVar14 & (ulong)dVar20;
          auVar3._8_4_ = (int)uVar5;
          auVar3._0_8_ = (ulong)-dVar18 & uVar13;
          auVar3._12_4_ = (int)(uVar5 >> 0x20);
          dVar2 = SUB168(auVar17 | auVar3,8);
          dVar16 = SUB168(auVar17 | auVar3,0);
          if (dVar2 <= dVar16) {
            dVar16 = dVar2;
          }
          if ((double)(~uVar12 & (ulong)dVar4 | (ulong)-dVar4 & uVar12) * 1000000000000.0 <= dVar16)
          goto LAB_005ced23;
          pQVar7 = (QSimplexConstraint *)operator_new(0x30);
          (pQVar7->variables).d = (Data *)0x0;
          pQVar7->constant = 0.0;
          pQVar7->ratio = Equal;
          (pQVar7->helper).first = (QConcreteSimplexVariable *)0x0;
          (pQVar7->helper).second = 0.0;
          pQVar7->artificial = (QConcreteSimplexVariable *)0x0;
          pQVar8 = (QSimplexConstraint *)&pAVar1->super_QSimplexVariable;
          if (pAVar1 == (AnchorData *)0x0) {
            pQVar8 = (QSimplexConstraint *)0x0;
          }
          local_48 = 1.0;
          local_40 = pQVar8;
          QHash<QSimplexVariable*,double>::emplace<double_const&>
                    ((QHash<QSimplexVariable*,double> *)pQVar7,(QSimplexVariable **)&local_40,
                     &local_48);
          pQVar7->constant = dVar18;
          pQVar7->ratio = MoreOrEqual;
          local_40 = pQVar7;
          QtPrivate::QPodArrayOps<QSimplexConstraint*>::emplace<QSimplexConstraint*&>
                    ((QPodArrayOps<QSimplexConstraint*> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_40);
          QList<QSimplexConstraint_*>::end(__return_storage_ptr__);
          if (pAVar1 == pAVar6) goto LAB_005cedb1;
          pQVar7 = (QSimplexConstraint *)operator_new(0x30);
          (pQVar7->variables).d = (Data *)0x0;
          pQVar7->constant = 0.0;
          pQVar7->ratio = Equal;
          (pQVar7->helper).first = (QConcreteSimplexVariable *)0x0;
          (pQVar7->helper).second = 0.0;
          pQVar7->artificial = (QConcreteSimplexVariable *)0x0;
          local_48 = 1.0;
          local_40 = pQVar8;
          QHash<QSimplexVariable*,double>::emplace<double_const&>
                    ((QHash<QSimplexVariable*,double> *)pQVar7,(QSimplexVariable **)&local_40,
                     &local_48);
          pQVar7->constant = dVar20;
          pQVar7->ratio = LessOrEqual;
          i = (__return_storage_ptr__->d).size;
          local_40 = pQVar7;
        }
        else {
LAB_005ced23:
          pQVar8 = (QSimplexConstraint *)operator_new(0x30);
          (pQVar8->variables).d = (Data *)0x0;
          pQVar8->constant = 0.0;
          pQVar8->ratio = Equal;
          (pQVar8->helper).first = (QConcreteSimplexVariable *)0x0;
          (pQVar8->helper).second = 0.0;
          pQVar8->artificial = (QConcreteSimplexVariable *)0x0;
          local_40 = (QSimplexConstraint *)&pAVar1->super_QSimplexVariable;
          if (pAVar1 == (AnchorData *)0x0) {
            local_40 = (QSimplexConstraint *)0x0;
          }
          local_48 = 1.0;
          QHash<QSimplexVariable*,double>::emplace<double_const&>
                    ((QHash<QSimplexVariable*,double> *)pQVar8,(QSimplexVariable **)&local_40,
                     &local_48);
          pQVar8->constant = dVar18;
          pQVar8->ratio = Equal;
          i = (__return_storage_ptr__->d).size;
          local_40 = pQVar8;
        }
        QtPrivate::QPodArrayOps<QSimplexConstraint*>::emplace<QSimplexConstraint*&>
                  ((QPodArrayOps<QSimplexConstraint*> *)__return_storage_ptr__,i,&local_40);
        QList<QSimplexConstraint_*>::end(__return_storage_ptr__);
        bVar9 = false;
      }
LAB_005cedb1:
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)(anchors->d).size);
    if (bVar9) goto LAB_005cedcc;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_005cee79:
  __stack_chk_fail();
}

Assistant:

QList<QSimplexConstraint *> QGraphicsAnchorLayoutPrivate::constraintsFromSizeHints(
    const QList<AnchorData *> &anchors)
{
    if (anchors.isEmpty())
        return QList<QSimplexConstraint *>();

    // Look for the layout edge. That can be either the first half in case the
    // layout is split in two, or the whole layout anchor.
    const Qt::Orientation orient = anchors.first()->isVertical ? Qt::Vertical : Qt::Horizontal;
    AnchorData *layoutEdge = nullptr;
    if (layoutCentralVertex[orient]) {
        layoutEdge = graph[orient].edgeData(layoutFirstVertex[orient], layoutCentralVertex[orient]);
    } else {
        layoutEdge = graph[orient].edgeData(layoutFirstVertex[orient], layoutLastVertex[orient]);
    }

    // If maxSize is less then "infinite", that means there are other anchors
    // grouped together with this one. We can't ignore its maximum value so we
    // set back the variable to NULL to prevent the continue condition from being
    // satisfied in the loop below.
    const qreal expectedMax = layoutCentralVertex[orient] ? QWIDGETSIZE_MAX / 2 : QWIDGETSIZE_MAX;
    qreal actualMax;
    if (layoutEdge->from == layoutFirstVertex[orient]) {
        actualMax = layoutEdge->maxSize;
    } else {
        actualMax = -layoutEdge->minSize;
    }
    if (actualMax != expectedMax) {
        layoutEdge = nullptr;
    }

    // For each variable, create constraints based on size hints
    QList<QSimplexConstraint *> anchorConstraints;
    bool unboundedProblem = true;
    for (int i = 0; i < anchors.size(); ++i) {
        AnchorData *ad = anchors.at(i);

        // Anchors that have their size directly linked to another one don't need constraints
        // For exammple, the second half of an item has exactly the same size as the first half
        // thus constraining the latter is enough.
        if (ad->dependency == AnchorData::Slave)
            continue;

        // To use negative variables inside simplex, we shift them so the minimum negative value is
        // mapped to zero before solving. To make sure that it works, we need to guarantee that the
        // variables are all inside a certain boundary.
        qreal boundedMin = qBound(-g_offset, ad->minSize, g_offset);
        qreal boundedMax = qBound(-g_offset, ad->maxSize, g_offset);

        if ((boundedMin == boundedMax) || qFuzzyCompare(boundedMin, boundedMax)) {
            QSimplexConstraint *c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMin;
            c->ratio = QSimplexConstraint::Equal;
            anchorConstraints += c;
            unboundedProblem = false;
        } else {
            QSimplexConstraint *c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMin;
            c->ratio = QSimplexConstraint::MoreOrEqual;
            anchorConstraints += c;

            // We avoid adding restrictions to the layout internal anchors. That's
            // to prevent unnecessary fair distribution from happening due to this
            // artificial restriction.
            if (ad == layoutEdge)
                continue;

            c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMax;
            c->ratio = QSimplexConstraint::LessOrEqual;
            anchorConstraints += c;
            unboundedProblem = false;
        }
    }

    // If no upper boundary restriction was added, add one to avoid unbounded problem
    if (unboundedProblem) {
        QSimplexConstraint *c = new QSimplexConstraint;
        c->variables.insert(layoutEdge, 1.0);
        // The maximum size that the layout can take
        c->constant = g_offset;
        c->ratio = QSimplexConstraint::LessOrEqual;
        anchorConstraints += c;
    }

    return anchorConstraints;
}